

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastDecimalToNumeric<int,unsigned_short>
               (int input,unsigned_short *result,CastParameters *parameters,uint8_t scale)

{
  string *msg;
  undefined7 in_register_00000009;
  long lVar1;
  short sVar2;
  allocator local_59;
  Exception local_58 [2];
  string error;
  
  lVar1 = (long)input;
  msg = (string *)
        (((long)((-(ulong)((uint)input >> 0x1f) ^
                 *(ulong *)(NumericHelper::POWERS_OF_TEN +
                           (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8)) +
                (ulong)((uint)input >> 0x1f)) / 2 + lVar1) /
        (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                        (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  sVar2 = (short)((ulong)msg >> 0x10);
  if (sVar2 == 0) {
    *result = (unsigned_short)msg;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_58,"Failed to cast decimal value %d to type %s",&local_59);
    Exception::ConstructMessage<long,duckdb::PhysicalType>
              (&error,local_58,msg,4,(PhysicalType)lVar1);
    ::std::__cxx11::string::~string((string *)local_58);
    HandleCastError::AssignError(&error,parameters);
    ::std::__cxx11::string::~string((string *)&error);
  }
  return sVar2 == 0;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}